

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucci.cpp
# Opt level: O2

CommEnum IdleLine(CommDetail *Command,int Debug)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  CommEnum CVar6;
  char *pcVar7;
  size_t sStack_40;
  char *local_30;
  
  while (pcVar4 = ReadInput(), pcVar4 == (char *)0x0) {
    Idle();
  }
  if (Debug != 0) {
    printf("info string %s\n",pcVar4);
    fflush(_stdout);
  }
  iVar2 = strcmp(pcVar4,"isready");
  if (iVar2 == 0) {
    return e_CommIsReady;
  }
  iVar2 = strncmp(pcVar4,"setoption ",10);
  if (iVar2 != 0) {
    iVar2 = strncmp(pcVar4,"position ",9);
    if (iVar2 == 0) {
      pcVar7 = pcVar4 + 9;
      local_30 = pcVar7;
      iVar2 = strncmp(pcVar7,"startpos",8);
      if (iVar2 == 0) {
        pcVar4 = "rnbakabnr/9/1c5c1/p1p1p1p1p/9/9/P1P1P1P1P/1C5C1/9/RNBAKABNR w - - 0 1";
      }
      else {
        iVar2 = strncmp(pcVar7,"midgamepos",10);
        if (iVar2 == 0) {
          pcVar4 = "2bakab1r/6r2/1cn4c1/p1p1p3p/9/2P3p2/PC2P1n1P/2N1B1NC1/R4R3/3AKAB2 w - - 0 1";
        }
        else {
          iVar2 = strncmp(pcVar7,"checkmatepos",0xc);
          if (iVar2 == 0) {
            pcVar4 = "4kar2/4a2rn/4bc3/RN1c5/2bC5/9/4p4/9/4p4/3p1K3 w - - 0 1";
          }
          else {
            iVar2 = strncmp(pcVar7,"zugzwangpos",0xb);
            if (iVar2 == 0) {
              pcVar4 = "3k5/4PP3/4r4/3P5/9/9/9/9/9/5K3 w - - 0 1";
            }
            else {
              iVar2 = strncmp(pcVar7,"endgamepos",10);
              if (iVar2 == 0) {
                pcVar4 = "4k4/4a4/4P4/9/9/9/9/4B4/9/4K4 w - - 0 1";
              }
              else {
                iVar2 = strncmp(pcVar7,"fen ",4);
                if (iVar2 != 0) {
                  return e_CommNone;
                }
                pcVar4 = pcVar4 + 0xd;
              }
            }
          }
        }
      }
      (Command->Position).FenStr = pcVar4;
      while( true ) {
        if (*pcVar7 == '\0') {
          (Command->Position).MoveNum = 0;
          (Command->Position).MoveStr = (char *)0x0;
          return e_CommPosition;
        }
        iVar2 = strncmp(pcVar7," moves ",7);
        if (iVar2 == 0) break;
        pcVar7 = pcVar7 + 1;
      }
      sVar5 = strlen(pcVar7 + 7);
      (Command->Position).MoveNum = (int)((sVar5 + 1) / 5);
      (Command->Position).MoveStr = pcVar7 + 7;
      return e_CommPosition;
    }
    iVar2 = strncmp(pcVar4,"banmoves ",9);
    if (iVar2 == 0) {
      sVar5 = strlen(pcVar4 + 9);
      (Command->Option).Type = (OptionEnum)((sVar5 + 1) / 5);
      (Command->BanMoves).MoveStr = pcVar4 + 9;
      return e_CommBanMoves;
    }
    cVar1 = *pcVar4;
    if (((cVar1 == 'g') && (pcVar4[1] == 'o')) && (pcVar4[2] == ' ')) {
      iVar2 = strncmp(pcVar4 + 3,"ponder ",7);
      pcVar7 = pcVar4 + 10;
      if (iVar2 != 0) {
        pcVar7 = pcVar4 + 3;
      }
      CVar6 = iVar2 == 0 | e_CommGo;
      iVar2 = strncmp(pcVar7,"time ",5);
      if (iVar2 == 0) {
        local_30 = pcVar7 + 5;
        iVar2 = ReadDigit(&local_30,36000);
        pcVar4 = local_30;
        (Command->Search).DepthTime.Depth = iVar2;
        iVar2 = strncmp(local_30," movestogo ",0xb);
        if (iVar2 == 0) {
          local_30 = pcVar4 + 0xb;
          (Command->Option).Type = e_OptionBatch;
          iVar3 = ReadDigit(&local_30,100);
          iVar2 = 1;
          if (1 < iVar3) {
            iVar2 = iVar3;
          }
          (Command->Position).MoveNum = iVar2;
          return CVar6;
        }
        iVar2 = strncmp(pcVar4," increment ",0xb);
        if (iVar2 == 0) {
          local_30 = pcVar4 + 0xb;
          (Command->Option).Type = e_OptionDebug;
          iVar2 = ReadDigit(&local_30,600);
        }
        else {
          iVar2 = 1;
          (Command->Option).Type = e_OptionBatch;
        }
        (Command->Position).MoveNum = iVar2;
        return CVar6;
      }
      iVar2 = strncmp(pcVar7,"depth ",6);
      if (iVar2 == 0) {
        local_30 = pcVar7 + 6;
        (Command->Option).Type = e_OptionNone;
        iVar2 = ReadDigit(&local_30,0x1f);
        (Command->Search).DepthTime.Depth = iVar2;
        return CVar6;
      }
      (Command->Position).FenStr = (char *)0x1f00000000;
      return CVar6;
    }
    iVar2 = strcmp(pcVar4,"stop");
    if (iVar2 == 0) {
      return e_CommStop;
    }
    iVar2 = strcmp(pcVar4,"quit");
    if (iVar2 == 0) {
      return e_CommQuit;
    }
    if (cVar1 != '/') {
      return e_CommNone;
    }
    if (pcVar4[1] == '/') {
      (Command->Position).FenStr = pcVar4;
      return e_CommAnnotation;
    }
    return e_CommNone;
  }
  pcVar7 = pcVar4 + 10;
  iVar2 = strncmp(pcVar7,"batch ",6);
  if (iVar2 == 0) {
    (Command->Option).Type = e_OptionBatch;
  }
  else {
    iVar2 = strncmp(pcVar7,"debug ",6);
    if (iVar2 != 0) {
      iVar2 = strncmp(pcVar7,"bookfiles ",10);
      if (iVar2 == 0) {
        (Command->Option).Type = e_OptionBookFiles;
LAB_0010b4f9:
        (Command->BanMoves).MoveStr = pcVar4 + 0x14;
        return e_CommSetOption;
      }
      iVar2 = strncmp(pcVar7,"egtbpaths ",10);
      if (iVar2 == 0) {
        (Command->Option).Type = e_OptionEgtbPaths;
        goto LAB_0010b4f9;
      }
      iVar2 = strncmp(pcVar7,"hashsize ",9);
      if (iVar2 == 0) {
        local_30 = pcVar4 + 0x13;
        (Command->Option).Type = e_OptionHashSize;
        iVar2 = 0x400;
LAB_0010b624:
        iVar2 = ReadDigit(&local_30,iVar2);
        (Command->Position).MoveNum = iVar2;
        return e_CommSetOption;
      }
      iVar2 = strncmp(pcVar7,"threads ",8);
      if (iVar2 == 0) {
        local_30 = pcVar4 + 0x12;
        (Command->Option).Type = e_OptionThreads;
        iVar2 = 0x20;
        goto LAB_0010b624;
      }
      iVar2 = strncmp(pcVar7,"drawmoves ",10);
      if (iVar2 == 0) {
        local_30 = pcVar4 + 0x14;
        (Command->Option).Type = e_OptionDrawMoves;
        iVar2 = 200;
        goto LAB_0010b624;
      }
      iVar2 = strncmp(pcVar7,"repetition ",0xb);
      if (iVar2 == 0) {
        pcVar4 = pcVar4 + 0x15;
        (Command->Option).Type = e_OptionRepetition;
        iVar2 = strncmp(pcVar4,"alwaysdraw",10);
        if (iVar2 == 0) goto LAB_0010b4bf;
        iVar2 = strncmp(pcVar4,"checkban",8);
        if (iVar2 == 0) goto LAB_0010b81f;
        pcVar7 = "asianrule";
        sStack_40 = 9;
      }
      else {
        iVar2 = strncmp(pcVar7,"pruning ",8);
        if (iVar2 == 0) {
          pcVar4 = pcVar4 + 0x12;
          (Command->Option).Type = e_OptionPruning;
        }
        else {
          iVar2 = strncmp(pcVar7,"knowledge ",10);
          if (iVar2 != 0) {
            iVar2 = strncmp(pcVar7,"selectivity ",0xc);
            if (iVar2 != 0) {
              iVar2 = strncmp(pcVar7,"style ",6);
              if (iVar2 != 0) {
                iVar2 = strncmp(pcVar7,"loadbook",8);
                if (iVar2 == 0) {
                  (Command->Option).Type = e_OptionLoadBook;
                  return e_CommSetOption;
                }
                iVar2 = strncmp(pcVar7,"newgame",7);
                if (iVar2 != 0) {
                  (Command->Option).Type = e_OptionNone;
                  return e_CommSetOption;
                }
                (Command->Option).Type = e_NewGame;
                return e_CommSetOption;
              }
              pcVar4 = pcVar4 + 0x10;
              (Command->Option).Type = e_OptionStyle;
              iVar2 = strncmp(pcVar4,"solid",5);
              if (iVar2 == 0) goto LAB_0010b4bf;
              iVar2 = strncmp(pcVar4,"normal",6);
              if ((iVar2 == 0) || (iVar2 = strncmp(pcVar4,"risky",5), iVar2 != 0))
              goto LAB_0010b81f;
              goto LAB_0010b838;
            }
            pcVar4 = pcVar4 + 0x16;
            (Command->Option).Type = e_OptionSelectivity;
            iVar2 = strncmp(pcVar4,"none",4);
            if (iVar2 == 0) goto LAB_0010b4bf;
            iVar2 = strncmp(pcVar4,"small",5);
            if (iVar2 != 0) {
              iVar2 = strncmp(pcVar4,"medium",6);
              if (iVar2 == 0) goto LAB_0010b838;
              iVar2 = strncmp(pcVar4,"large",5);
              if (iVar2 != 0) goto LAB_0010b4bf;
              goto LAB_0010b74f;
            }
            goto LAB_0010b81f;
          }
          pcVar4 = pcVar4 + 0x14;
          (Command->Option).Type = e_OptionKnowledge;
        }
        iVar2 = strncmp(pcVar4,"none",4);
        if (iVar2 == 0) goto LAB_0010b4bf;
        iVar2 = strncmp(pcVar4,"small",5);
        if (iVar2 == 0) goto LAB_0010b81f;
        pcVar7 = "medium";
        sStack_40 = 6;
      }
      iVar2 = strncmp(pcVar4,pcVar7,sStack_40);
      if (iVar2 != 0) {
LAB_0010b74f:
        (Command->Position).MoveNum = 3;
        return e_CommSetOption;
      }
LAB_0010b838:
      (Command->Position).MoveNum = 2;
      return e_CommSetOption;
    }
    (Command->Option).Type = e_OptionDebug;
  }
  if (((pcVar4[0x10] == 'o') && (pcVar4[0x11] == 'n')) ||
     (iVar2 = strncmp(pcVar4 + 0x10,"true",4), iVar2 == 0)) {
LAB_0010b81f:
    (Command->Position).MoveNum = 1;
    return e_CommSetOption;
  }
LAB_0010b4bf:
  (Command->Position).MoveNum = 0;
  return e_CommSetOption;
}

Assistant:

CommEnum IdleLine(CommDetail &Command, int /* bool */ Debug) {
    const char *LineStr;
    CommEnum RetValue;
    LineStr = ReadInput();
    while (LineStr == NULL) {
        Idle();
        LineStr = ReadInput();
    }
    if (Debug) {
        printf("info string %s\n", LineStr);
        fflush(stdout);
    }
    // "IdleLine()"是最复杂的UCCI指令解释器，大多数的UCCI指令都由它来解释，包括：

    // 1. "isready"指令
    if (strcmp(LineStr, "isready") == 0) {
        return e_CommIsReady;

        // 2. "setoption <option> [<arguments>]"指令
    } else if (strncmp(LineStr, "setoption ", 10) == 0) {
        LineStr += 10;

        // (i) "batch"选项
        if (strncmp(LineStr, "batch ", 6) == 0) {
            LineStr += 6;
            Command.Option.Type = e_OptionBatch;
            if (strncmp(LineStr, "on", 2) == 0) {
                Command.Option.Value.Check = e_CheckTrue;
            } else if (strncmp(LineStr, "true", 4) == 0) {
                Command.Option.Value.Check = e_CheckTrue;
            } else {
                Command.Option.Value.Check = e_CheckFalse;
            } // 由于"batch"选项默认是关闭的，所以只有设定"on"或"true"时才打开，下同

            // (ii) "debug"选项
        } else if (strncmp(LineStr, "debug ", 6) == 0) {
            LineStr += 6;
            Command.Option.Type = e_OptionDebug;
            if (strncmp(LineStr, "on", 2) == 0) {
                Command.Option.Value.Check = e_CheckTrue;
            } else if (strncmp(LineStr, "true", 4) == 0) {
                Command.Option.Value.Check = e_CheckTrue;
            } else {
                Command.Option.Value.Check = e_CheckFalse;
            }

            // (iii) "bookfiles"选项
        } else if (strncmp(LineStr, "bookfiles ", 10) == 0) {
            Command.Option.Type = e_OptionBookFiles;
            Command.Option.Value.String = LineStr + 10;

            // (iv) "egtbpaths"选项
        } else if (strncmp(LineStr, "egtbpaths ", 10) == 0) {
            Command.Option.Type = e_OptionEgtbPaths;
            Command.Option.Value.String = LineStr + 10;

            // (v) "hashsize"选项
        } else if (strncmp(LineStr, "hashsize ", 9) == 0) {
            LineStr += 9;
            Command.Option.Type = e_OptionHashSize;
            Command.Option.Value.Spin = ReadDigit(LineStr, 1024);

            // (vi) "threads"选项
        } else if (strncmp(LineStr, "threads ", 8) == 0) {
            LineStr += 8;
            Command.Option.Type = e_OptionThreads;
            Command.Option.Value.Spin = ReadDigit(LineStr, 32);

            // (vii) "drawmoves"选项
        } else if (strncmp(LineStr, "drawmoves ", 10) == 0) {
            LineStr += 10;
            Command.Option.Type = e_OptionDrawMoves;
            Command.Option.Value.Spin = ReadDigit(LineStr, 200);

            // (viii) "repetition"选项
        } else if (strncmp(LineStr, "repetition ", 11) == 0) {
            LineStr += 11;
            Command.Option.Type = e_OptionRepetition;
            if (strncmp(LineStr, "alwaysdraw", 10) == 0) {
                Command.Option.Value.Repetition = e_RepetitionAlwaysDraw;
            } else if (strncmp(LineStr, "checkban", 8) == 0) {
                Command.Option.Value.Repetition = e_RepetitionCheckBan;
            } else if (strncmp(LineStr, "asianrule", 9) == 0) {
                Command.Option.Value.Repetition = e_RepetitionAsianRule;
            } else if (strncmp(LineStr, "chineserule", 11) == 0) {
                Command.Option.Value.Repetition = e_RepetitionChineseRule;
            } else {
                Command.Option.Value.Repetition = e_RepetitionChineseRule;
            }

            // (ix) "pruning"选项
        } else if (strncmp(LineStr, "pruning ", 8) == 0) {
            LineStr += 8;
            Command.Option.Type = e_OptionPruning;
            if (strncmp(LineStr, "none", 4) == 0) {
                Command.Option.Value.Scale = e_ScaleNone;
            } else if (strncmp(LineStr, "small", 5) == 0) {
                Command.Option.Value.Scale = e_ScaleSmall;
            } else if (strncmp(LineStr, "medium", 6) == 0) {
                Command.Option.Value.Scale = e_ScaleMedium;
            } else if (strncmp(LineStr, "large", 5) == 0) {
                Command.Option.Value.Scale = e_ScaleLarge;
            } else {
                Command.Option.Value.Scale = e_ScaleLarge;
            }

            // (x) "knowledge"选项
        } else if (strncmp(LineStr, "knowledge ", 10) == 0) {
            LineStr += 10;
            Command.Option.Type = e_OptionKnowledge;
            if (strncmp(LineStr, "none", 4) == 0) {
                Command.Option.Value.Scale = e_ScaleNone;
            } else if (strncmp(LineStr, "small", 5) == 0) {
                Command.Option.Value.Scale = e_ScaleSmall;
            } else if (strncmp(LineStr, "medium", 6) == 0) {
                Command.Option.Value.Scale = e_ScaleMedium;
            } else if (strncmp(LineStr, "large", 5) == 0) {
                Command.Option.Value.Scale = e_ScaleLarge;
            } else {
                Command.Option.Value.Scale = e_ScaleLarge;
            }

            // (xi) "selectivity"选项
        } else if (strncmp(LineStr, "selectivity ", 12) == 0) {
            LineStr += 12;
            Command.Option.Type = e_OptionSelectivity;
            if (strncmp(LineStr, "none", 4) == 0) {
                Command.Option.Value.Scale = e_ScaleNone;
            } else if (strncmp(LineStr, "small", 5) == 0) {
                Command.Option.Value.Scale = e_ScaleSmall;
            } else if (strncmp(LineStr, "medium", 6) == 0) {
                Command.Option.Value.Scale = e_ScaleMedium;
            } else if (strncmp(LineStr, "large", 5) == 0) {
                Command.Option.Value.Scale = e_ScaleLarge;
            } else {
                Command.Option.Value.Scale = e_ScaleNone;
            }

            // (xii) "style"选项
        } else if (strncmp(LineStr, "style ", 6) == 0) {
            LineStr += 6;
            Command.Option.Type = e_OptionStyle;
            if (strncmp(LineStr, "solid", 5) == 0) {
                Command.Option.Value.Style = e_StyleSolid;
            } else if (strncmp(LineStr, "normal", 6) == 0) {
                Command.Option.Value.Style = e_StyleNormal;
            } else if (strncmp(LineStr, "risky", 5) == 0) {
                Command.Option.Value.Style = e_StyleRisky;
            } else {
                Command.Option.Value.Style = e_StyleNormal;
            }

            // (xiii) "loadbook"选项
        } else if (strncmp(LineStr, "loadbook", 8) == 0) {
            Command.Option.Type = e_OptionLoadBook;

            // (xiv) 无法识别的选项，有扩充的余地
        } else if (strncmp(LineStr, "newgame", 7) == 0){
            Command.Option.Type = e_NewGame;
            //开始新一轮比赛或挑战
        } else {
            Command.Option.Type = e_OptionNone;
        }
        return e_CommSetOption;

        // 3. "position {<special_position> | fen <fen_string>} [moves <move_list>]"指令
    } else if (strncmp(LineStr, "position ", 9) == 0) {
        LineStr += 9;

        // 首先判断是否是特殊局面(这里规定了5种)，是特殊局面就直接转换成对应的FEN串
        if (strncmp(LineStr, "startpos", 8) == 0) {
            Command.Position.FenStr = "rnbakabnr/9/1c5c1/p1p1p1p1p/9/9/P1P1P1P1P/1C5C1/9/RNBAKABNR w - - 0 1";
        } else if (strncmp(LineStr, "midgamepos", 10) == 0) {
            Command.Position.FenStr = "2bakab1r/6r2/1cn4c1/p1p1p3p/9/2P3p2/PC2P1n1P/2N1B1NC1/R4R3/3AKAB2 w - - 0 1";
        } else if (strncmp(LineStr, "checkmatepos", 12) == 0) {
            Command.Position.FenStr = "4kar2/4a2rn/4bc3/RN1c5/2bC5/9/4p4/9/4p4/3p1K3 w - - 0 1";
        } else if (strncmp(LineStr, "zugzwangpos", 11) == 0) {
            Command.Position.FenStr = "3k5/4PP3/4r4/3P5/9/9/9/9/9/5K3 w - - 0 1";
        } else if (strncmp(LineStr, "endgamepos", 10) == 0) {
            Command.Position.FenStr = "4k4/4a4/4P4/9/9/9/9/4B4/9/4K4 w - - 0 1";
            // 然后判断是否指定了FEN串
        } else if (strncmp(LineStr, "fen ", 4) == 0) {
            Command.Position.FenStr = LineStr + 4;
            // 如果两者都不是，就立即返回
        } else {
            return e_CommNone;
        }
        // 然后寻找是否指定了后续着法，即是否有"moves"关键字
        while (*LineStr != '\0') {
            if (strncmp(LineStr, " moves ", 7) == 0) {
                LineStr += 7;
                Command.Position.MoveNum = int((strlen(LineStr) + 1) / 5); // 提示："moves"后面的每个着法都是4个字符和1个空格
                Command.Position.MoveStr = LineStr;
                return e_CommPosition;
            }
            LineStr ++;
        }
        Command.Position.MoveNum = 0;
        Command.Position.MoveStr = NULL;
        return e_CommPosition;

        // 4. "banmoves <move_list>"指令，处理起来和"position ... moves ..."是一样的
    } else if (strncmp(LineStr, "banmoves ", 9) == 0) {
        LineStr += 9;
        Command.BanMoves.MoveNum = int((strlen(LineStr) + 1) / 5);
        Command.BanMoves.MoveStr = LineStr;
        return e_CommBanMoves;

        // 5. "go [ponder] {infinite | depth <depth> | time <time> [movestogo <moves_to_go> | increment <inc_time>]}"指令
    } else if (strncmp(LineStr, "go ", 3) == 0) {
        LineStr += 3;
        // 首先判断到底是"go"还是"go ponder"，因为两者解释成不同的指令
        if (strncmp(LineStr, "ponder ", 7) == 0) {
            LineStr += 7;
            RetValue = e_CommGoPonder;
        } else {
            RetValue = e_CommGo;
        }
        // 然后判断到底是固定深度还是设定时限
        if (strncmp(LineStr, "time ", 5) == 0) {
            LineStr += 5;
            Command.Search.DepthTime.Time = ReadDigit(LineStr, 36000);
            // 如果是设定时限，就要判断是时段制还是加时制
            if (strncmp(LineStr, " movestogo ", 11) == 0) {
                LineStr += 11;
                Command.Search.Mode = e_TimeMove;
                Command.Search.TimeMode.MovesToGo = ReadDigit(LineStr, 100);
                if (Command.Search.TimeMode.MovesToGo < 1) {
                    Command.Search.TimeMode.MovesToGo = 1;
                }
            } else if (strncmp(LineStr, " increment ", 11) == 0) {
                LineStr += 11;
                Command.Search.Mode = e_TimeInc;
                Command.Search.TimeMode.Increment = ReadDigit(LineStr, 600);
                // 如果没有说明是时段制还是加时制，就设定为步数是1的时段制
            } else {
                Command.Search.Mode = e_TimeMove;
                Command.Search.TimeMode.MovesToGo = 1;
            }
        } else if (strncmp(LineStr, "depth ", 6) == 0) {
            LineStr += 6;
            Command.Search.Mode = e_TimeDepth;
            Command.Search.DepthTime.Depth = ReadDigit(LineStr, c_MaxDepth - 1);
            // 如果没有说明是固定深度还是设定时限，就固定深度为"c_MaxDepth"
        } else {
            Command.Search.Mode = e_TimeDepth;
            Command.Search.DepthTime.Depth = c_MaxDepth - 1;
        }
        return RetValue;

        // 5. "stop"指令
    } else if (strcmp(LineStr, "stop") == 0) {
        return e_CommStop;

        // 6. "quit"指令
    } else if (strcmp(LineStr, "quit") == 0) {
        return e_CommQuit;

        // 7. 重要信息
    } else if (strncmp(LineStr, "//", 2) == 0) {
    	Command.Annotation.String = LineStr;
    	return e_CommAnnotation;

    	// 8. 无法识别的指令
    } else {
        return e_CommNone;
    }
}